

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

JoinNode * __thiscall GraphBuilder::addNode<JoinNode>(GraphBuilder *this,JoinNode *node)

{
  bool bVar1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool> pVar2;
  __node_gen_type __node_gen;
  JoinNode *local_30;
  CallInst *local_28;
  JoinNode *local_20;
  
  local_30 = node;
  local_28 = Node::callInstruction(&node->super_Node);
  std::
  _Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,JoinNode*>,std::allocator<std::pair<llvm::CallInst_const*const,JoinNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<llvm::CallInst_const*,JoinNode*&>
            ((_Hashtable<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,JoinNode*>,std::allocator<std::pair<llvm::CallInst_const*const,JoinNode*>>,std::__detail::_Select1st,std::equal_to<llvm::CallInst_const*>,std::hash<llvm::CallInst_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->llvmToJoins_,&local_28,&local_30);
  bVar1 = Node::isArtificial(&local_30->super_Node);
  if (bVar1) {
    local_28 = (CallInst *)&this->artificialNodes_;
    local_20 = local_30;
    pVar2 = std::
            _Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<Node*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Node*,false>>>>
                      ((_Hashtable<Node*,Node*,std::allocator<Node*>,std::__detail::_Identity,std::equal_to<Node*>,std::hash<Node*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_28);
  }
  else {
    local_28 = (CallInst *)Node::llvmInstruction(&local_30->super_Node);
    pVar2 = (pair<std::__detail::_Node_iterator<Node_*,_true,_false>,_bool>)
            std::
            _Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llvm::Instruction_const*,JoinNode*&>
                      ((_Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->llvmToNodeMap_,&local_28,&local_30);
  }
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_30 = (JoinNode *)0x0;
  }
  return local_30;
}

Assistant:

JoinNode *GraphBuilder::addNode(JoinNode *node) {
    llvmToJoins_.emplace(node->callInstruction(), node);
    if (node->isArtificial()) {
        if (this->artificialNodes_.insert(node).second) {
            return node;
        }
    } else {
        if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                    .second) {
            return node;
        }
    }

    return nullptr;
}